

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O1

void anon_unknown.dwarf_353df4::check<float>(istream *is,float c)

{
  size_t sVar1;
  ostream *poVar2;
  char *__s;
  uchar b [4];
  float local_14;
  
  std::istream::read((char *)is,(long)&local_14);
  __s = _fread + (*_fread == '*');
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": expected ",0xb);
  poVar2 = std::ostream::_M_insert<double>((double)c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", got ",6);
  poVar2 = std::ostream::_M_insert<double>((double)local_14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((local_14 == c) && (!NAN(local_14) && !NAN(c))) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = float]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}